

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O2

int prune_mode_by_skip_rd
              (AV1_COMP *cpi,MACROBLOCK *x,MACROBLOCKD *xd,BLOCK_SIZE bsize,int64_t ref_skip_rd,
              int mode_rate)

{
  BLOCK_SIZE plane_bsize;
  int iVar1;
  int64_t iVar2;
  int is_luma_only;
  int *in_stack_ffffffffffffffa8;
  undefined4 uStack_50;
  int bh;
  macroblockd_plane *pd;
  int bw;
  
  iVar1 = (cpi->sf).inter_sf.txfm_rd_gate_level
          [(ulong)(((cpi->common).seq_params)->enable_masked_compound != '\0') * 2];
  if (iVar1 != 0) {
    pd = xd->plane;
    plane_bsize = av1_ss_size_lookup[bsize][xd->plane[0].subsampling_x][xd->plane[0].subsampling_y];
    is_luma_only = (int)&bh;
    get_txb_dimensions(xd,0,plane_bsize,(uint)plane_bsize,(int)&bw,(BLOCK_SIZE)&bh,
                       in_stack_ffffffffffffffa8,(int *)CONCAT44(bh,uStack_50),(int *)pd,
                       (int *)ref_skip_rd);
    iVar2 = calculate_sse(xd,x->plane,pd,bw,bh);
    iVar1 = check_txfm_eval(x,bsize,ref_skip_rd,
                            ((long)x->rdmult * (long)mode_rate + 0x100 >> 9) + iVar2 * 0x800,iVar1,
                            is_luma_only);
    return iVar1;
  }
  return 1;
}

Assistant:

static inline int prune_mode_by_skip_rd(const AV1_COMP *const cpi,
                                        MACROBLOCK *x, MACROBLOCKD *xd,
                                        const BLOCK_SIZE bsize,
                                        int64_t ref_skip_rd, int mode_rate) {
  int eval_txfm = 1;
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cpi->common.seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_COMP_TYPE_MODE, /*eval_motion_mode=*/0);
  // Check if the mode is good enough based on skip rd
  if (txfm_rd_gate_level) {
    int64_t sse_y = compute_sse_plane(x, xd, PLANE_TYPE_Y, bsize);
    int64_t skip_rd = RDCOST(x->rdmult, mode_rate, (sse_y << 4));
    eval_txfm =
        check_txfm_eval(x, bsize, ref_skip_rd, skip_rd, txfm_rd_gate_level, 1);
  }
  return eval_txfm;
}